

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O3

void __thiscall
asio::detail::strand_service::
dispatch<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>,std::error_code,unsigned_long>>
          (strand_service *this,implementation_type *impl,
          binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>
          *handler)

{
  io_context_impl *owner;
  error_category *peVar1;
  bool bVar2;
  long *plVar3;
  handler_allocator *op;
  handler_allocator *phVar4;
  template_rebind_alloc<completion_handler<binder2<custom_alloc_handler<_Bind<void_(connection<transport_config>::*(shared_ptr<connection<transport_config>_>,_function<void_(const_error_code_&)>,__Placeholder<1>,__Placeholder<2>))(function<void_(const_error_code_&)>,_const_error_code_&,_unsigned_long)>_>,_error_code,_unsigned_long>_>_>
  a;
  long in_FS_OFFSET;
  on_dispatch_exit on_exit;
  context ctx;
  ptr local_70;
  on_dispatch_exit local_58;
  implementation_type local_48;
  implementation_type *local_40;
  undefined8 local_38;
  error_code local_30;
  
  plVar3 = *(long **)(in_FS_OFFSET + -8);
  if (plVar3 != (long *)0x0) {
    do {
      if ((implementation_type)*plVar3 == *impl) {
        if (plVar3[1] != 0) {
          local_70.v = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                        *)(handler->arg1_)._M_cat;
          local_48 = (implementation_type)handler->arg2_;
          local_70.h = (binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>
                        *)CONCAT44(local_70.h._4_4_,(handler->arg1_)._M_value);
          std::
          __invoke_impl<void,void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*&)(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>&,std::function<void(std::error_code_const&)>&,std::error_code&,unsigned_long&>
                    (&(handler->handler_).handler_,
                     &(handler->handler_).handler_._M_bound_args.
                      super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                      .
                      super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
                     ,&(handler->handler_).handler_._M_bound_args);
          return;
        }
        break;
      }
      plVar3 = (long *)plVar3[2];
    } while (plVar3 != (long *)0x0);
  }
  phVar4 = (handler->handler_).allocator_;
  local_70.h = handler;
  if (phVar4->m_in_use == false) {
    phVar4->m_in_use = true;
    op = phVar4;
  }
  else {
    op = (handler_allocator *)operator_new(0x78);
    phVar4 = (handler->handler_).allocator_;
  }
  *(undefined8 *)&op->m_storage = 0;
  *(code **)((long)&op->m_storage + 8) =
       completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
       ::do_complete;
  *(undefined4 *)((long)&op->m_storage + 0x10) = 0;
  *(handler_allocator **)((long)&op->m_storage + 0x18) = phVar4;
  local_70.v = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                *)op;
  std::
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>
  ::_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>
           *)((long)&op->m_storage + 0x20),&(handler->handler_).handler_);
  peVar1 = (handler->arg1_)._M_cat;
  *(undefined8 *)((long)&op->m_storage + 0x60) = *(undefined8 *)&handler->arg1_;
  *(error_category **)((long)&op->m_storage + 0x68) = peVar1;
  *(unsigned_long *)((long)&op->m_storage + 0x70) = handler->arg2_;
  local_70.p = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                *)op;
  bVar2 = do_dispatch(this,impl,(operation *)op);
  local_70.v = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                *)0x0;
  local_70.p = (completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
                *)0x0;
  if (bVar2) {
    local_48 = *impl;
    local_38 = *(undefined8 *)(in_FS_OFFSET + -8);
    local_40 = &local_48;
    *(implementation_type **)(in_FS_OFFSET + -8) = local_40;
    owner = this->io_context_;
    local_58.impl_ = *impl;
    local_30._M_value = 0;
    local_58.io_context_ = owner;
    local_30._M_cat = (error_category *)std::_V2::system_category();
    completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
    ::do_complete(owner,(operation *)op,&local_30,0);
    on_dispatch_exit::~on_dispatch_exit(&local_58);
    *(undefined8 *)(in_FS_OFFSET + -8) = local_38;
  }
  completion_handler<asio::detail::binder2<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>_>
  ::ptr::reset(&local_70);
  return;
}

Assistant:

void strand_service::dispatch(strand_service::implementation_type& impl,
    Handler& handler)
{
  // If we are already in the strand then the handler can run immediately.
  if (call_stack<strand_impl>::contains(impl))
  {
    fenced_block b(fenced_block::full);
    asio_handler_invoke_helpers::invoke(handler, handler);
    return;
  }

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "dispatch"));

  bool dispatch_immediately = do_dispatch(impl, p.p);
  operation* o = p.p;
  p.v = p.p = 0;

  if (dispatch_immediately)
  {
    // Indicate that this strand is executing on the current thread.
    call_stack<strand_impl>::context ctx(impl);

    // Ensure the next handler, if any, is scheduled on block exit.
    on_dispatch_exit on_exit = { &io_context_, impl };
    (void)on_exit;

    completion_handler<Handler>::do_complete(
        &io_context_, o, asio::error_code(), 0);
  }
}